

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strstr.c
# Opt level: O3

char * strstr(char *__haystack,char *__needle)

{
  char *pcVar1;
  char *pcVar2;
  char *p1;
  long lVar3;
  char cVar4;
  
  if (*__haystack != '\0') {
    pcVar2 = __haystack;
    do {
      if (*__needle == '\0') {
        return __haystack;
      }
      lVar3 = 0;
      cVar4 = *__needle;
      while (pcVar2[lVar3] == cVar4) {
        cVar4 = __needle[lVar3 + 1];
        lVar3 = lVar3 + 1;
        if (cVar4 == '\0') {
          return pcVar2;
        }
      }
      pcVar1 = pcVar2 + 1;
      pcVar2 = pcVar2 + 1;
    } while (*pcVar1 != '\0');
  }
  return (char *)0x0;
}

Assistant:

char * strstr( const char * s1, const char * s2 )
{
    const char * p1 = s1;
    const char * p2;

    while ( *s1 )
    {
        p2 = s2;

        while ( *p2 && ( *p1 == *p2 ) )
        {
            ++p1;
            ++p2;
        }

        if ( ! *p2 )
        {
            return ( char * ) s1;
        }

        ++s1;
        p1 = s1;
    }

    return NULL;
}